

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O1

int input_intelhex(char *fname,int *start,int *length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  int lval;
  int ladr;
  int ll;
  int lt;
  int local_64;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int *local_48;
  int *local_40;
  FILE *local_38;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar7 = 0x8000;
    iVar5 = 1;
    local_64 = 0;
    local_48 = length;
    local_40 = start;
    local_38 = __stream;
    do {
      memset(sline,0,0x100);
      iVar1 = fgetc(__stream);
      uVar4 = 0;
      do {
        if (iVar1 == -1) goto LAB_00102429;
        if (iVar1 == 10) {
          bVar8 = uVar4 < 0xb;
          goto LAB_00102408;
        }
        sline[uVar4] = (char)iVar1;
        uVar4 = uVar4 + 1;
        iVar1 = fgetc(__stream);
      } while (uVar4 != 0xff);
      if (iVar1 == -1) {
LAB_00102423:
        iVar1 = -1;
      }
      else {
        bVar8 = false;
LAB_00102408:
        if ((bVar8) || (sline[0] != ':')) {
          puts("Invalid Intel Hex format.");
          iVar5 = 0;
          goto LAB_00102423;
        }
      }
LAB_00102429:
      iVar3 = -1;
      if ((((iVar1 != -1) &&
           (iVar2 = __isoc99_sscanf(sline,":%2x%4x%2x",&local_58,&local_5c,&local_4c), iVar3 = iVar1
           , iVar2 == 3)) && (local_58 + local_5c < 0x8001)) && (local_4c == 0)) {
        iVar1 = local_58 + local_5c + (local_5c >> 8);
        if (local_5c < iVar7) {
          iVar7 = local_5c;
        }
        if (local_58 < 1) {
          lVar6 = 9;
        }
        else {
          iVar2 = 9;
          lVar6 = 0;
          local_54 = iVar7;
          local_50 = iVar5;
          do {
            __isoc99_sscanf(sline + iVar2,"%2x",&local_60);
            ebuf[local_5c + lVar6] = (uint8)local_60;
            iVar1 = iVar1 + local_60;
            lVar6 = lVar6 + 1;
            iVar2 = iVar2 + 2;
          } while (lVar6 < local_58);
          lVar6 = (long)iVar2;
          __stream = local_38;
          iVar7 = local_54;
          iVar5 = local_50;
        }
        iVar2 = (local_58 - iVar7) + local_5c;
        if (local_64 < iVar2) {
          local_64 = iVar2;
        }
        iVar2 = __isoc99_sscanf(sline + lVar6,"%2x",&local_60);
        if ((iVar2 == 0) || ((-iVar1 & 0xffU) != local_60)) {
          puts("Invalid checksum.");
          iVar5 = 0;
          iVar3 = -1;
        }
      }
    } while (iVar3 != -1);
    if (iVar5 != 0) {
      *local_48 = local_64;
      *local_40 = iVar7;
    }
    fclose(__stream);
  }
  return iVar5;
}

Assistant:

int input_intelhex(char *fname, int *start, int *length)
{
   FILE *fp;
 
   int c, sc, retval = 1;
   int ll, ladr, lt, sn, i, lval;
   int hstart, hlength, sum;

   fp = fopen(fname, "r");
   if(fp == NULL) 
      return 0;
   hstart = MAXBUF;
   hlength = 0;
   sum = 0;
   do
   {
      memset(sline, 0x00, MAXSLENGTH);
      sc = 0;
      while (((c = fgetc(fp)) != EOF) && (c != 0x0A) && (sc < (MAXSLENGTH -1)))
         sline[sc++] = (uint8)c;
      if ((c != EOF) && ((sc < 11) || (sline[0] != ':')))
      {
         c = EOF;
         retval = 0;
         printf("Invalid Intel Hex format.\n");
      }
      if (c != EOF)
      {
         sn = sscanf(sline , ":%2x%4x%2x", &ll, &ladr, &lt);
         if ((sn == 3) && ((ladr + ll) <= MAXBUF) && (lt == 0))
         {
            sum = ll + (ladr >> 8) + (ladr & 0xff) + lt;
            if(ladr < hstart) hstart = ladr;
            for(i = 0; i < ll ; i++)
            {
               sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
               ebuf[ladr + i] = (uint8)lval;
               sum += (uint8)lval;
            }
            if(((ladr + ll) - hstart) > hlength)
               hlength = (ladr + ll) - hstart;
            sum = (0x100 - sum) & 0xff;
            sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
            if (!sn || ((sum - lval) != 0))
            {
               c = EOF;
               retval = 0;
               printf("Invalid checksum.\n");
            }
         }
      }      
   }
   while (c != EOF);
   if (retval)
   {
      *length = hlength;
      *start = hstart;
   }
   fclose(fp);
   
   return retval;
}